

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::RecordBytesSent(CConnman *this,uint64_t bytes)

{
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock95;
  unique_lock<std::mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&uStack_28,&this->m_total_bytes_sent_mutex,
             "m_total_bytes_sent_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0xe42,false);
  this->nTotalBytesSent = this->nTotalBytesSent + bytes;
  tVar1 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  if ((this->nMaxOutboundCycleStartTime).__r + 0x15180 < (long)tVar1.__d.__r) {
    (this->nMaxOutboundCycleStartTime).__r = (rep)tVar1.__d.__r;
    this->nMaxOutboundTotalBytesSentInCycle = 0;
    uVar2 = 0;
  }
  else {
    uVar2 = this->nMaxOutboundTotalBytesSentInCycle;
  }
  this->nMaxOutboundTotalBytesSentInCycle = uVar2 + bytes;
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::RecordBytesSent(uint64_t bytes)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    LOCK(m_total_bytes_sent_mutex);

    nTotalBytesSent += bytes;

    const auto now = GetTime<std::chrono::seconds>();
    if (nMaxOutboundCycleStartTime + MAX_UPLOAD_TIMEFRAME < now)
    {
        // timeframe expired, reset cycle
        nMaxOutboundCycleStartTime = now;
        nMaxOutboundTotalBytesSentInCycle = 0;
    }

    nMaxOutboundTotalBytesSentInCycle += bytes;
}